

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

UINT8 __thiscall GYMPlayer::Stop(GYMPlayer *this)

{
  GYM_CHIPDEV *pGVar1;
  reference cBaseDev;
  GYM_CHIPDEV *cDev;
  size_t curDev;
  GYMPlayer *this_local;
  
  this->_playState = this->_playState & 0xfe;
  cDev = (GYM_CHIPDEV *)0x0;
  while( true ) {
    pGVar1 = (GYM_CHIPDEV *)
             std::vector<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>::size
                       (&this->_devices);
    if (pGVar1 <= cDev) break;
    cBaseDev = std::vector<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>::
               operator[](&this->_devices,(size_type)cDev);
    FreeDeviceTree(&cBaseDev->base,'\0');
    cDev = (GYM_CHIPDEV *)((long)&(cDev->base).defInf.dataPtr + 1);
  }
  std::vector<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>::clear
            (&this->_devices);
  if ((this->super_PlayerBase)._eventCbFunc != (PLAYER_EVENT_CB)0x0) {
    (*(this->super_PlayerBase)._eventCbFunc)
              (&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x02',(void *)0x0);
  }
  return '\0';
}

Assistant:

UINT8 GYMPlayer::Stop(void)
{
	size_t curDev;
	
	_playState &= ~PLAYSTATE_PLAY;
	
	for (curDev = 0; curDev < _devices.size(); curDev ++)
	{
		GYM_CHIPDEV* cDev = &_devices[curDev];
		FreeDeviceTree(&cDev->base, 0);
	}
	_devices.clear();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_STOP, NULL);
	
	return 0x00;
}